

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O3

void Bmcg_ManPrintFrame(Bmcg_Man_t *p,int f,int nClauses,int Solver,abctime clkStart)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bmcg_sat_solver *pbVar4;
  Gia_Man_t *p_00;
  double dVar5;
  undefined1 auVar6 [16];
  timespec ts;
  timespec local_30;
  
  if (p->pPars->fVerbose != 0) {
    Abc_Print((int)p,"%4d %s : ",f,"+");
    iVar1 = bmcg_sat_solver_varnum(p->pSats[0]);
    pbVar4 = p->pSats[0];
    iVar2 = bmcg_sat_solver_elim_varnum(pbVar4);
    Abc_Print((int)pbVar4,"Var =%8.0f.  ",(double)(iVar1 - iVar2));
    pbVar4 = p->pSats[0];
    iVar1 = bmcg_sat_solver_clausenum(pbVar4);
    Abc_Print((int)pbVar4,"Cla =%9.0f.  ",(double)iVar1);
    pbVar4 = p->pSats[0];
    iVar1 = bmcg_sat_solver_learntnum(pbVar4);
    Abc_Print((int)pbVar4,"Learn =%9.0f.  ",(double)iVar1);
    pbVar4 = p->pSats[0];
    iVar1 = bmcg_sat_solver_conflictnum(pbVar4);
    iVar2 = (int)pbVar4;
    Abc_Print(iVar2,"Conf =%9.0f.  ",(double)iVar1);
    if (1 < p->pPars->nProcs) {
      Abc_Print(iVar2,"S = %3d. ",(ulong)(uint)Solver);
    }
    p_00 = p->pFrames;
    dVar5 = Gia_ManMemory(p_00);
    iVar1 = (p->vFr2Sat).nCap;
    auVar6._8_4_ = iVar1 >> 0x1f;
    auVar6._0_8_ = (long)iVar1;
    auVar6._12_4_ = 0x45300000;
    Abc_Print((int)p_00,"%4.0f MB",
              (((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 4.0 + 16.0 +
              (double)(int)dVar5) * 9.5367431640625e-07);
    iVar2 = 3;
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    Abc_Print(iVar2,"%9.2f sec  ",(double)((float)(lVar3 - clkStart) / 1e+06));
    putchar(10);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Bmcg_ManPrintFrame( Bmcg_Man_t * p, int f, int nClauses, int Solver, abctime clkStart )
{
    int fUnfinished = 0;
    if ( !p->pPars->fVerbose )
        return;
    Abc_Print( 1, "%4d %s : ", f,   fUnfinished ? "-" : "+" );
//    Abc_Print( 1, "Var =%8.0f.  ",  (double)p->nSatVars ); 
//    Abc_Print( 1, "Cla =%9.0f.  ",  (double)nClauses );  
    Abc_Print( 1, "Var =%8.0f.  ",  (double)(bmcg_sat_solver_varnum(p->pSats[0])-bmcg_sat_solver_elim_varnum(p->pSats[0])) ); 
    Abc_Print( 1, "Cla =%9.0f.  ",  (double)bmcg_sat_solver_clausenum(p->pSats[0]) );  
    Abc_Print( 1, "Learn =%9.0f.  ",(double)bmcg_sat_solver_learntnum(p->pSats[0]) );  
    Abc_Print( 1, "Conf =%9.0f.  ", (double)bmcg_sat_solver_conflictnum(p->pSats[0]) );  
    if ( p->pPars->nProcs > 1 )
        Abc_Print( 1, "S = %3d. ",  Solver );
    Abc_Print( 1, "%4.0f MB",       1.0*((int)Gia_ManMemory(p->pFrames) + Vec_IntMemory(&p->vFr2Sat))/(1<<20) );
    Abc_Print( 1, "%9.2f sec  ",    (float)(Abc_Clock() - clkStart)/(float)(CLOCKS_PER_SEC) );
    printf( "\n" );
    fflush( stdout );
}